

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2ModDel::set(V2ModDel *this,syVModDel *para)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = (para->amount + -64.0) * 0.015625;
  this->wetout = fVar3;
  this->dryout = 1.0 - ABS(fVar3);
  this->fbval = (para->fb + -64.0) * 0.015625;
  fVar3 = ((float)this->dbufmask + -1023.0) * 0.0078125;
  uVar1 = para->llength;
  uVar2 = para->rlength;
  *(ulong *)this->dboffs = CONCAT44((int)(fVar3 * (float)uVar2),(int)(fVar3 * (float)uVar1));
  fVar3 = this->inst->SRfclinfreq;
  fVar4 = exp2f((para->mrate * 0.0078125 + -1.0) * 10.0);
  this->mfreq = (int)(fVar4 * fVar3 * 1973915.5);
  this->mmaxoffs = (int)(para->mdepth * 1023.0 * 0.0078125);
  this->mphase = (int)((para->mphase + -64.0) * 0.0078125 * 2.1474836e+09) * 2;
  return;
}

Assistant:

void set(const syVModDel *para)
    {
        wetout = (para->amount - 64.0f) / 64.0f;
        dryout = 1.0f - fabsf(wetout);
        fbval = (para->fb - 64.0f) / 64.0f;

        float lenscale = ((float)dbufmask - 1023.0f) / 128.0f;
        dboffs[0] = (int)(para->llength * lenscale);
        dboffs[1] = (int)(para->rlength * lenscale);

        mfreq = (int)(inst->SRfclinfreq * fcmdlfomul * calcfreq(para->mrate / 128.0f));
        mmaxoffs = (int)(para->mdepth * 1023.0f / 128.0f);
        mphase = ftou32((para->mphase - 64.0f) / 128.0f);
    }